

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>_>_>
::~table_core(table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>_>_>
              *this)

{
  value_type_pointer p;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::DefinitionSymbol_*,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<std::pair<const_slang::ast::DefinitionSymbol_*const,_std::vector<const_slang::ast::Symbol_*,_std::allocator<const_slang::ast::Symbol_*>_>_>_>_>
  *local_18;
  undefined1 *local_10;
  
  local_10 = (undefined1 *)&local_18;
  local_18 = this;
  for_all_elements_while<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____external_boost_unordered_hpp:6939:48)>
            (&this->arrays,(anon_class_8_1_54a39806 *)&local_10);
  p = (this->arrays).elements_;
  if (p != (value_type_pointer)0x0) {
    operator_delete(p,(this->arrays).groups_size_mask * 0x1f0 + 0x1f0 & 0xffffffffffffffe0);
  }
  return;
}

Assistant:

~table_core() noexcept {
        for_all_elements([this](element_type* p) { destroy_element(p); });
        delete_arrays(arrays);
    }